

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationFactoredDecPOMDPDiscrete.cpp
# Opt level: O1

double __thiscall
SimulationFactoredDecPOMDPDiscrete::RunSimulation
          (SimulationFactoredDecPOMDPDiscrete *this,JointPolicyDiscrete *jp)

{
  FactoredDecPOMDPDiscreteInterface *pFVar1;
  void *pvVar2;
  int iVar3;
  Index IVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  ulong uVar6;
  Index i;
  ulong uVar7;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oIs;
  double sumR;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ohIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sIs;
  double r;
  allocator_type local_b9;
  JointPolicyDiscrete *local_b8;
  value_type_conflict1 local_ac;
  string local_a8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_88;
  double local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  double local_38;
  size_type __n;
  
  local_b8 = jp;
  iVar3 = (*(this->_m_puFactored->super_PlanningUnitDecPOMDPDiscrete).super_PlanningUnitMADPDiscrete
            .super_PlanningUnit._vptr_PlanningUnit[6])();
  __n = CONCAT44(extraout_var,iVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_50,__n,(allocator_type *)&local_a8);
  local_70 = 0.0;
  local_a8._M_dataplus._M_p._0_4_ = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_68,__n,(value_type_conflict1 *)&local_a8,(allocator_type *)&local_88);
  pFVar1 = this->_m_puFactored->_m_fDecPOMDP;
  (**(code **)(*(long *)((long)&pFVar1->field_0x0 + *(long *)(*(long *)pFVar1 + -0xf8)) + 0x1f0))
            ((long)&pFVar1->field_0x0 + *(long *)(*(long *)pFVar1 + -0xf8),&local_50);
  if ((this->super_SimulationDecPOMDPDiscrete).super_Simulation._m_verbose == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Simulation::RunSimulation ",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x50);
    std::ostream::put(-0x50);
    poVar5 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,"Simulation::RunSimulation set initial state to ",0x2f);
    PrintTools::SoftPrintVector<unsigned_int>(&local_a8,&local_50);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar5,(char *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,
                                                local_a8._M_dataplus._M_p._0_4_),
                        local_a8._M_string_length);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_) !=
        &local_a8.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_),
                      local_a8.field_2._M_allocated_capacity + 1);
    }
  }
  local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x7fffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,__n,
             (value_type_conflict1 *)&local_88,(allocator_type *)&local_ac);
  local_ac = 0x7fffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_88,__n,&local_ac,&local_b9);
  if ((this->super_SimulationDecPOMDPDiscrete)._m_horizon != 0) {
    uVar6 = 0;
    do {
      JointPolicyDiscrete::SampleJointActionVector
                (local_b8,&local_68,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8
                );
      Step(this,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_a8,(uint)uVar6,
           &local_50,&local_88,&local_38,&local_70,0.0);
      if (uVar6 < (this->super_SimulationDecPOMDPDiscrete)._m_horizon - 1 && __n != 0) {
        uVar7 = 0;
        do {
          IVar4 = PlanningUnitMADPDiscrete::GetSuccessorOHI
                            ((PlanningUnitMADPDiscrete *)this->_m_puFactored,(Index)uVar7,
                             local_68.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar7],
                             *(Index *)(CONCAT44(local_88.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                                 local_88.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                       uVar7 * 4));
          local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start[uVar7] = IVar4;
          uVar7 = (ulong)((Index)uVar7 + 1);
        } while (__n != uVar7);
      }
      uVar6 = (ulong)((uint)uVar6 + 1);
    } while (uVar6 < (this->super_SimulationDecPOMDPDiscrete)._m_horizon);
  }
  local_b8 = (JointPolicyDiscrete *)local_70;
  pvVar2 = (void *)CONCAT44(local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_88.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,(long)local_88.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar2);
  }
  pvVar2 = (void *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,local_a8._M_dataplus._M_p._0_4_);
  if (pvVar2 != (void *)0x0) {
    operator_delete(pvVar2,local_a8.field_2._M_allocated_capacity - (long)pvVar2);
  }
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (double)local_b8;
}

Assistant:

double
SimulationFactoredDecPOMDPDiscrete::RunSimulation(const JointPolicyDiscrete *jp) const
{
    size_t nrAgents=_m_puFactored->GetNrAgents();
    std::vector<Index> sIs(nrAgents);
    unsigned int t;
    double r,sumR=0;

    vector<Index> ohIs(nrAgents,0); // INITIAL_OHI does not exist
    
    _m_puFactored->GetFDPOMDPD()->SampleInitialState(sIs);

    if(GetVerbose())
        cout << "Simulation::RunSimulation " << endl
             << "Simulation::RunSimulation set initial state to " 
             << SoftPrintVector(sIs) << endl;

    vector<Index> aIs(nrAgents,INT_MAX),
        oIs(nrAgents,INT_MAX);

    for(t=0;t<_m_horizon;t++)
    {	
        jp->SampleJointActionVector(ohIs,aIs);

        Step(aIs, t, sIs, oIs, r, sumR, 0);
        
        /* action taken at ts=0,...,hor-1 - therefore only observation
         * histories at ts=0,...,hor-2 have successors.*/
        if(t < _m_horizon-1) 
        {
            for(Index i=0;i!=nrAgents;++i)
                ohIs[i] = _m_puFactored->GetSuccessorOHI(i, ohIs[i], oIs[i]);
        }
    }

    return(sumR);
}